

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void CheckName(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  byte bVar1;
  Bool BVar2;
  uint uVar3;
  Node *pNVar4;
  ctmbstr s;
  byte *str;
  tchar c;
  uint local_2c;
  
  if ((attval == (AttVal *)0x0) || (str = (byte *)attval->value, str == (byte *)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
    return;
  }
  BVar2 = prvTidyIsAnchorElement(doc,node);
  if (BVar2 != no) {
    if (*(int *)((doc->config).value + 100) != 0) {
      do {
        bVar1 = *str;
        if (bVar1 == 0) goto LAB_00137e3f;
        local_2c = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar3 = prvTidyGetUTF8((ctmbstr)str,&local_2c);
          str = str + uVar3;
        }
        str = str + 1;
        BVar2 = prvTidyIsXMLNamechar(local_2c);
      } while (BVar2 != no);
      prvTidyReportAttrError(doc,node,attval,0x22b);
    }
LAB_00137e3f:
    pNVar4 = GetNodeByAnchor(doc,attval->value);
    if (pNVar4 == node || pNVar4 == (Node *)0x0) {
      AddAnchor(doc,attval->value,node);
    }
    else {
      if (node->implicit == no) {
        uVar3 = 0x223;
      }
      else {
        uVar3 = 0x224;
      }
      prvTidyReportAttrError(doc,node,attval,uVar3);
    }
  }
  return;
}

Assistant:

void CheckName( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    Node *old;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    if ( TY_(IsAnchorElement)(doc, node) )
    {
        if (cfgBool(doc, TidyXmlOut) && !IsValidNMTOKEN(attval->value))
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);

        if ((old = GetNodeByAnchor(doc, attval->value)) &&  old != node)
        {
            if (node->implicit) /* Is #709 - improve warning text */
                TY_(ReportAttrError)(doc, node, attval, ANCHOR_DUPLICATED);
            else
                TY_(ReportAttrError)( doc, node, attval, ANCHOR_NOT_UNIQUE);
        }
        else
            AddAnchor( doc, attval->value, node );
    }
}